

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall Json::StyledStreamWriter::writeArrayValue(StyledStreamWriter *this,Value *value)

{
  bool bVar1;
  byte bVar2;
  ArrayIndex AVar3;
  Value *root;
  long lVar4;
  ulong uVar5;
  ArrayIndex index;
  allocator local_61;
  String local_60;
  pointer local_40;
  pointer local_38;
  
  AVar3 = Value::size(value);
  if (AVar3 == 0) {
    std::__cxx11::string::string((string *)&local_60,"[]",&local_61);
    pushValue(this,&local_60);
  }
  else {
    bVar1 = isMultilineArray(this,value);
    if (!bVar1) {
      uVar5 = (long)(this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar5 == AVar3) {
        std::operator<<(this->document_,"[ ");
        lVar4 = 0;
        while (bVar1 = uVar5 != 0, uVar5 = uVar5 - 1, bVar1) {
          if (lVar4 != 0) {
            std::operator<<(this->document_,", ");
          }
          std::operator<<(this->document_,
                          (string *)
                          ((long)&(((this->childValues_).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar4));
          lVar4 = lVar4 + 0x20;
        }
        std::operator<<(this->document_," ]");
        return;
      }
      __assert_fail("childValues_.size() == size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/external/jsoncpp/src/lib_json/json_writer.cpp"
                    ,0x2ff,"void Json::StyledStreamWriter::writeArrayValue(const Value &)");
    }
    std::__cxx11::string::string((string *)&local_60,"[",&local_61);
    writeWithIndent(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    indent(this);
    local_38 = (this->childValues_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (this->childValues_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    index = 0;
    lVar4 = 0;
    while( true ) {
      root = Value::operator[](value,index);
      writeCommentBeforeValue(this,root);
      if (local_38 == local_40) {
        bVar2 = this->field_0x68;
        if ((bVar2 & 2) == 0) {
          writeIndent(this);
          bVar2 = this->field_0x68;
        }
        this->field_0x68 = bVar2 | 2;
        writeValue(this,root);
        this->field_0x68 = this->field_0x68 & 0xfd;
      }
      else {
        writeWithIndent(this,(String *)
                             ((long)&(((this->childValues_).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar4));
      }
      if ((ulong)AVar3 * 0x20 + -0x20 == lVar4) break;
      std::operator<<(this->document_,",");
      writeCommentAfterValueOnSameLine(this,root);
      lVar4 = lVar4 + 0x20;
      index = index + 1;
    }
    writeCommentAfterValueOnSameLine(this,root);
    unindent(this);
    std::__cxx11::string::string((string *)&local_60,"]",&local_61);
    writeWithIndent(this,&local_60);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void StyledStreamWriter::writeArrayValue(const Value& value) {
  unsigned size = value.size();
  if (size == 0)
    pushValue("[]");
  else {
    bool isArrayMultiLine = isMultilineArray(value);
    if (isArrayMultiLine) {
      writeWithIndent("[");
      indent();
      bool hasChildValue = !childValues_.empty();
      unsigned index = 0;
      for (;;) {
        const Value& childValue = value[index];
        writeCommentBeforeValue(childValue);
        if (hasChildValue)
          writeWithIndent(childValues_[index]);
        else {
          if (!indented_)
            writeIndent();
          indented_ = true;
          writeValue(childValue);
          indented_ = false;
        }
        if (++index == size) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *document_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("]");
    } else // output on a single line
    {
      assert(childValues_.size() == size);
      *document_ << "[ ";
      for (unsigned index = 0; index < size; ++index) {
        if (index > 0)
          *document_ << ", ";
        *document_ << childValues_[index];
      }
      *document_ << " ]";
    }
  }
}